

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O1

void __thiscall libtorrent::aux::listen_socket_t::listen_socket_t(listen_socket_t *this)

{
  long lVar1;
  
  (this->super_utp_socket_interface)._vptr_utp_socket_interface =
       (_func_int **)&PTR_get_local_endpoint_004f37a8;
  ip_voter::ip_voter(&this->external_address);
  *(undefined8 *)&(this->local_endpoint).impl_.data_ = 0;
  *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 8) = 0;
  *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 0xc) = 0;
  *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 0x14) = 0;
  *(undefined8 *)&(this->local_endpoint).impl_.data_ = 2;
  (this->netmask).type_ = ipv4;
  (this->netmask).ipv4_address_ = (in4_addr_type)0x0;
  *(undefined8 *)&(this->netmask).ipv6_address_.addr_.__in6_u = 0;
  *(undefined8 *)((long)&(this->netmask).ipv6_address_.addr_.__in6_u + 8) = 0;
  (this->netmask).ipv6_address_.scope_id_ = 0;
  (this->device)._M_dataplus._M_p = (pointer)&(this->device).field_2;
  (this->device)._M_string_length = 0;
  (this->device).field_2._M_local_buf[0] = '\0';
  this->original_port = 0;
  lVar1 = 0;
  do {
    *(undefined8 *)
     ((long)&(this->tcp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>.
             _M_elems[0].mapping.m_val + lVar1) = 0xffffffff;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  lVar1 = 0;
  do {
    *(undefined8 *)
     ((long)&(this->udp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>.
             _M_elems[0].mapping.m_val + lVar1) = 0xffffffff;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  this->ssl = plaintext;
  this->flags = '\x01';
  (this->sock).
  super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->sock).
  super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->udp_sock).
  super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->udp_sock).
  super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->natpmp_mapper).super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->natpmp_mapper).super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->upnp_mapper).super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->upnp_mapper).super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lsd).super___shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->lsd).super___shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->incoming_connection = false;
  return;
}

Assistant:

listen_socket_t() = default;